

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

bool __thiscall QString::startsWith(QString *this,QChar c,CaseSensitivity cs)

{
  char16_t cVar1;
  char16_t cVar2;
  bool bVar3;
  
  if ((this->d).size != 0) {
    cVar1 = *(this->d).ptr;
    if (cs == CaseSensitive) {
      bVar3 = cVar1 == c.ucs;
    }
    else {
      cVar1 = foldCase(cVar1);
      cVar2 = foldCase(c.ucs);
      bVar3 = cVar1 == cVar2;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool QString::startsWith(QChar c, Qt::CaseSensitivity cs) const
{
    if (!size())
        return false;
    if (cs == Qt::CaseSensitive)
        return at(0) == c;
    return foldCase(at(0)) == foldCase(c);
}